

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radefs_p.h
# Opt level: O2

Error __thiscall
asmjit::RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_>::nonOverlappingUnionOf
          (RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *this,ZoneAllocator *allocator,
          RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *x,
          RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *y,DataType *yData)

{
  uint uVar1;
  uint uVar2;
  RALiveInterval *pRVar3;
  RALiveInterval *pRVar4;
  Error EVar5;
  ulong uVar6;
  ulong uVar7;
  RALiveInterval *pRVar8;
  RALiveInterval *pRVar9;
  RALiveSpan<asmjit::LiveRegData> *pRVar10;
  RALiveSpan<asmjit::LiveRegData> *p;
  RALiveInterval *pRVar11;
  RALiveInterval *pRVar12;
  RALiveInterval *pRVar13;
  uint32_t uVar14;
  
  EVar5 = ZoneVector<asmjit::RALiveSpan<asmjit::LiveRegData>_>::reserve
                    (&this->_data,allocator,
                     (y->_data).super_ZoneVectorBase._size + (x->_data).super_ZoneVectorBase._size);
  if (EVar5 == 0) {
    p = (RALiveSpan<asmjit::LiveRegData> *)(this->_data).super_ZoneVectorBase._data;
    pRVar11 = (RALiveInterval *)(x->_data).super_ZoneVectorBase._data;
    pRVar8 = (RALiveInterval *)(y->_data).super_ZoneVectorBase._data;
    uVar6 = (ulong)(x->_data).super_ZoneVectorBase._size;
    pRVar13 = (RALiveInterval *)((long)pRVar11 + uVar6 * 0xc);
    uVar7 = (ulong)(y->_data).super_ZoneVectorBase._size;
    pRVar9 = (RALiveInterval *)((long)pRVar8 + uVar7 * 0xc);
    pRVar12 = pRVar11;
    if (uVar7 != 0 && uVar6 != 0) {
      uVar14 = pRVar11->a;
      pRVar4 = pRVar8;
      pRVar10 = p;
      do {
        while (pRVar8 = pRVar4, uVar1 = pRVar8->b, uVar14 < uVar1) {
          uVar1 = pRVar8->a;
          while (uVar2 = pRVar11->b, uVar2 <= uVar1) {
            p = pRVar10 + 1;
            (pRVar10->super_RALiveInterval).a = pRVar11->a;
            (pRVar10->super_RALiveInterval).b = uVar2;
            (pRVar10->super_LiveRegData).id = pRVar11[1].a;
            pRVar11 = (RALiveInterval *)&pRVar11[1].b;
            pRVar10 = p;
            pRVar12 = pRVar13;
            if (pRVar11 == pRVar13) goto LAB_0011e4b4;
          }
          uVar14 = pRVar11->a;
          pRVar4 = pRVar8;
          if (uVar14 < pRVar8->b) {
            return 0xffffffff;
          }
        }
        (pRVar10->super_RALiveInterval).a = pRVar8->a;
        (pRVar10->super_RALiveInterval).b = uVar1;
        (pRVar10->super_LiveRegData).id = yData->id;
        p = pRVar10 + 1;
        pRVar3 = pRVar8 + 1;
        pRVar8 = pRVar9;
        pRVar4 = (RALiveInterval *)&pRVar3->b;
        pRVar10 = p;
        pRVar12 = pRVar11;
      } while ((RALiveInterval *)&pRVar3->b != pRVar9);
    }
LAB_0011e4b4:
    for (; pRVar12 != pRVar13; pRVar12 = (RALiveInterval *)&pRVar12[1].b) {
      p->super_RALiveInterval = *pRVar12;
      (p->super_LiveRegData).id = pRVar12[1].a;
      p = p + 1;
    }
    for (; pRVar8 != pRVar9; pRVar8 = (RALiveInterval *)&pRVar8[1].b) {
      p->super_RALiveInterval = *pRVar8;
      (p->super_LiveRegData).id = yData->id;
      p = p + 1;
    }
    ZoneVector<asmjit::RALiveSpan<asmjit::LiveRegData>_>::_setEndPtr(&this->_data,p);
    EVar5 = 0;
  }
  return EVar5;
}

Assistant:

ASMJIT_INLINE Error nonOverlappingUnionOf(ZoneAllocator* allocator, const RALiveSpans<T>& x, const RALiveSpans<T>& y, const DataType& yData) noexcept {
    uint32_t finalSize = x.size() + y.size();
    ASMJIT_PROPAGATE(_data.reserve(allocator, finalSize));

    T* dstPtr = _data.data();
    const T* xSpan = x.data();
    const T* ySpan = y.data();

    const T* xEnd = xSpan + x.size();
    const T* yEnd = ySpan + y.size();

    // Loop until we have intersection or either `xSpan == xEnd` or `ySpan == yEnd`,
    // which means that there is no intersection. We advance either `xSpan` or `ySpan`
    // depending on their ranges.
    if (xSpan != xEnd && ySpan != yEnd) {
      uint32_t xa, ya;
      xa = xSpan->a;
      for (;;) {
        while (ySpan->b <= xa) {
          dstPtr->init(*ySpan, yData);
          dstPtr++;
          if (++ySpan == yEnd)
            goto Done;
        }

        ya = ySpan->a;
        while (xSpan->b <= ya) {
          *dstPtr++ = *xSpan;
          if (++xSpan == xEnd)
            goto Done;
        }

        // We know that `xSpan->b > ySpan->a`, so check if `ySpan->b > xSpan->a`.
        xa = xSpan->a;
        if (ySpan->b > xa)
          return 0xFFFFFFFFu;
      }
    }

  Done:
    while (xSpan != xEnd) {
      *dstPtr++ = *xSpan++;
    }

    while (ySpan != yEnd) {
      dstPtr->init(*ySpan, yData);
      dstPtr++;
      ySpan++;
    }

    _data._setEndPtr(dstPtr);
    return kErrorOk;
  }